

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeContBind
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType sourceType,
          HeapType targetType)

{
  optional<wasm::HeapType> dest;
  bool bVar1;
  Err *pEVar2;
  ContBind *expr;
  optional<wasm::HeapType> src;
  Ok local_2c1;
  IRBuilder *local_2c0;
  Err local_2b8;
  Err *local_298;
  Err *err_2;
  undefined1 local_288 [8];
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_230 [8];
  Result<wasm::Ok> _val_1;
  Err local_200;
  Err *local_1e0;
  Err *err;
  bool bStack_1d0;
  undefined7 uStack_1cf;
  undefined1 local_1c8 [12];
  ChildPopper local_1b8;
  undefined1 local_1b0 [8];
  Result<wasm::Ok> _val;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  HeapType local_e8;
  Signature local_e0;
  size_t local_d0;
  size_t targetParams;
  Signature local_c0;
  size_t local_b0;
  size_t sourceParams;
  Type local_a0;
  undefined1 local_98 [8];
  ContBind curr;
  allocator<char> local_49;
  Err local_48;
  IRBuilder *local_28;
  IRBuilder *this_local;
  HeapType targetType_local;
  HeapType sourceType_local;
  
  local_28 = this;
  this_local = (IRBuilder *)targetType.id;
  targetType_local = sourceType;
  bVar1 = HeapType::isContinuation(&targetType_local);
  if ((bVar1) && (bVar1 = HeapType::isContinuation((HeapType *)&this_local), bVar1)) {
    ContBind::ContBind((ContBind *)local_98,&this->wasm->allocator);
    sourceParams = (size_t)this_local;
    wasm::Type::Type(&local_a0,(HeapType)this_local,NonNullable,Inexact);
    curr.super_SpecificExpression<(wasm::Expression::Id)91>.super_Expression._0_8_ = local_a0.id;
    targetParams = (size_t)HeapType::getContinuation(&targetType_local);
    local_c0 = HeapType::getSignature((HeapType *)&targetParams);
    local_b0 = wasm::Type::size(&local_c0.params);
    local_e8.id = (uintptr_t)HeapType::getContinuation((HeapType *)&this_local);
    local_e0 = HeapType::getSignature(&local_e8);
    local_d0 = wasm::Type::size(&local_e0.params);
    if (local_b0 < local_d0) {
      HeapType::toString_abi_cxx11_(&local_168,&targetType_local);
      std::operator+(&local_148,"incompatible continuation types in cont.bind: source type ",
                     &local_168);
      std::operator+(&local_128,&local_148," has fewer parameters than target ");
      HeapType::toString_abi_cxx11_
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(HeapType *)&this_local
                );
      std::operator+(&local_108,&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&local_108);
      wasm::Err::~Err((Err *)&local_108);
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
    }
    else {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 &curr.super_SpecificExpression<(wasm::Expression::Id)91>.super_Expression.type,
                 local_b0 - local_d0);
      ChildPopper::ChildPopper(&local_1b8,this);
      std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                ((optional<wasm::HeapType> *)local_1c8,&targetType_local);
      std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                ((optional<wasm::HeapType> *)&err,(HeapType *)&this_local);
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = bStack_1d0;
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = uStack_1cf;
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)local_1c8._0_8_;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1c8[8];
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1c8._9_3_;
      ChildPopper::visitContBind
                ((Result<wasm::Ok> *)local_1b0,&local_1b8,(ContBind *)local_98,src,dest);
      local_1e0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_1b0);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_1e0 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_200,local_1e0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_200);
        wasm::Err::~Err(&local_200);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1b0);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        anon_unknown_282::validateTypeAnnotation
                  ((Result<wasm::Ok> *)local_230,targetType_local,
                   (Expression *)curr.operands.allocator);
        pEVar2 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_230);
        if (pEVar2 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar2);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_230);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          err_2 = (Err *)this_local;
          anon_unknown_282::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_288,(HeapType)this_local,(Expression *)local_98);
          local_298 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_288);
          bVar1 = local_298 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_2b8,local_298);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_2b8);
            wasm::Err::~Err(&local_2b8);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_288);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            local_2c0 = this_local;
            expr = Builder::makeContBind
                             (&this->builder,(HeapType)this_local,
                              (ExpressionList *)
                              &curr.super_SpecificExpression<(wasm::Expression::Id)91>.
                               super_Expression.type,(Expression *)curr.operands.allocator);
            push(this,(Expression *)expr);
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_2c1);
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected continuation types",&local_49);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_48);
    wasm::Err::~Err(&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeContBind(HeapType sourceType, HeapType targetType) {
  if (!sourceType.isContinuation() || !targetType.isContinuation()) {
    return Err{"expected continuation types"};
  }
  ContBind curr(wasm.allocator);

  curr.type = Type(targetType, NonNullable);
  size_t sourceParams =
    sourceType.getContinuation().type.getSignature().params.size();
  size_t targetParams =
    targetType.getContinuation().type.getSignature().params.size();
  if (sourceParams < targetParams) {
    return Err{"incompatible continuation types in cont.bind: source type " +
               sourceType.toString() + " has fewer parameters than target " +
               targetType.toString()};
  }
  curr.operands.resize(sourceParams - targetParams);
  CHECK_ERR(ChildPopper{*this}.visitContBind(&curr, sourceType, targetType));
  CHECK_ERR(validateTypeAnnotation(sourceType, curr.cont));
  CHECK_ERR(validateTypeAnnotation(targetType, &curr));

  push(builder.makeContBind(targetType, std::move(curr.operands), curr.cont));
  return Ok{};
}